

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_>::on_bin
          (int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  undefined1 uVar1;
  uint uVar2;
  int num_digits_00;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> *in_RDI;
  bin_writer<1> unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  format_specs in_stack_00000020;
  int num_digits;
  
  if (*(char *)((long)(in_RDI->locale_).locale_ + 9) < '\0') {
    uVar2 = *(uint *)&in_RDI[1].locale_.locale_;
    *(uint *)&in_RDI[1].locale_.locale_ = uVar2 + 1;
    *(undefined1 *)((long)&in_RDI[1].out_.container + (ulong)uVar2 + 4) = 0x30;
    uVar1 = *(undefined1 *)((long)(in_RDI->locale_).locale_ + 8);
    uVar2 = *(uint *)&in_RDI[1].locale_.locale_;
    *(uint *)&in_RDI[1].locale_.locale_ = uVar2 + 1;
    *(undefined1 *)((long)&in_RDI[1].out_.container + (ulong)uVar2 + 4) = uVar1;
  }
  num_digits_00 = count_digits<1u,unsigned_int>(*(uint *)&in_RDI[1].out_.container);
  get_prefix((int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_> *)0xf047fb);
  basic_writer<duckdb_fmt::v6::buffer_range<char>>::
  write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<char,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<1>>
            (in_RDI,num_digits_00,(string_view)in_stack_00000008,in_stack_00000020,unaff_retaddr);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }